

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O0

Vec_Ptr_t * Nwk_ManDfsReverse(Nwk_Man_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *vNodes_00;
  Nwk_Obj_t *pNVar2;
  int local_24;
  int i;
  Nwk_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Nwk_Man_t *pNtk_local;
  
  Nwk_ManIncrementTravId(pNtk);
  vNodes_00 = Vec_PtrAlloc(100);
  for (local_24 = 0; iVar1 = Vec_PtrSize(pNtk->vCis), local_24 < iVar1; local_24 = local_24 + 1) {
    pNVar2 = (Nwk_Obj_t *)Vec_PtrEntry(pNtk->vCis,local_24);
    iVar1 = Nwk_ObjIsPi(pNVar2);
    if (iVar1 != 0) {
      Nwk_ManDfsReverse_rec(pNVar2,vNodes_00);
    }
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pNVar2 = (Nwk_Obj_t *)Vec_PtrEntry(pNtk->vObjs,local_24);
    if ((((pNVar2 != (Nwk_Obj_t *)0x0) && (iVar1 = Nwk_ObjIsNode(pNVar2), iVar1 != 0)) &&
        (iVar1 = Nwk_ObjFaninNum(pNVar2), iVar1 == 0)) &&
       (iVar1 = Nwk_ObjIsTravIdCurrent(pNVar2), iVar1 == 0)) {
      Vec_PtrPush(vNodes_00,pNVar2);
    }
  }
  return vNodes_00;
}

Assistant:

Vec_Ptr_t * Nwk_ManDfsReverse( Nwk_Man_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Nwk_Obj_t * pObj;
    int i;
    Nwk_ManIncrementTravId( pNtk );
    vNodes = Vec_PtrAlloc( 100 );
    Nwk_ManForEachPi( pNtk, pObj, i )
        Nwk_ManDfsReverse_rec( pObj, vNodes );
    // add nodes without fanins
    Nwk_ManForEachNode( pNtk, pObj, i )
        if ( Nwk_ObjFaninNum(pObj) == 0 && !Nwk_ObjIsTravIdCurrent(pObj) )
            Vec_PtrPush( vNodes, pObj );
    return vNodes;
}